

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::test_ToLower::test_method(test_ToLower *this)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  string_view str;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 local_111 [9];
  undefined1 local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 local_d0 [32];
  string **local_b0;
  string *local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  string **local_88;
  char **local_80;
  char *local_78;
  assertion_result local_70;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4f3;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_80 = (char **)local_d0;
  local_d0[0] = 0x40;
  local_a8 = (string *)local_111;
  local_111[0] = 0x40;
  local_58._M_dataplus._M_p._0_1_ = 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_70._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70.m_message.px = (element_type *)0xf730f4;
  local_88 = (string **)&local_80;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013af670;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_d0[0x10] = '\0';
  local_b0 = &local_a8;
  local_d0._8_8_ = &PTR__lazy_ostream_013af670;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79a97,
             (size_t)&local_70,0x4f3,&local_a0,"\'@\'",local_d0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4f4;
  file_00.m_begin = (iterator)&local_128;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_138,
             msg_00);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_d0[0] = 0x61;
  local_111[0] = 0x61;
  local_58._M_dataplus._M_p._0_1_ = 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_70._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70.m_message.px = (element_type *)0xf730f4;
  local_80 = (char **)local_d0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013af670;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = (string **)&local_80;
  local_a8 = (string *)local_111;
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013af670;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_a8;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79aa8,
             (size_t)&local_70,0x4f4,&local_a0,"\'a\'",local_d0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4f5;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_d0[0] = 0x7a;
  local_111[0] = 0x7a;
  local_58._M_dataplus._M_p._0_1_ = 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_70._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70.m_message.px = (element_type *)0xf730f4;
  local_80 = (char **)local_d0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013af670;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = (string **)&local_80;
  local_a8 = (string *)local_111;
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013af670;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_a8;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79ab9,
             (size_t)&local_70,0x4f5,&local_a0,"\'z\'",local_d0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4f6;
  file_02.m_begin = (iterator)&local_168;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_178,
             msg_02);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_d0[0] = 0x5b;
  local_111[0] = 0x5b;
  local_58._M_dataplus._M_p._0_1_ = 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_70._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70.m_message.px = (element_type *)0xf730f4;
  local_80 = (char **)local_d0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013af670;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = (string **)&local_80;
  local_a8 = (string *)local_111;
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013af670;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_a8;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79aca,
             (size_t)&local_70,0x4f6,&local_a0,"\'[\'",local_d0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4f7;
  file_03.m_begin = (iterator)&local_188;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_198,
             msg_03);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_111[0] = 0;
  local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
  local_58._M_dataplus._M_p._0_1_ = 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_70._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70.m_message.px = (element_type *)0xf730f4;
  local_80 = (char **)local_111;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013af670;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = (string **)&local_80;
  local_a8 = (string *)local_d0;
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013ae248;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_a8;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79adb,
             (size_t)&local_70,0x4f7,&local_a0,"0",local_d0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4f8;
  file_04.m_begin = (iterator)&local_1a8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b8,
             msg_04);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_d0[0] = 0xff;
  local_111[0] = 0xff;
  local_58._M_dataplus._M_p._0_1_ = 1;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_70._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70.m_message.px = (element_type *)0xf730f4;
  local_80 = (char **)local_d0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013af670;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = (string **)&local_80;
  local_a8 = (string *)local_111;
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013af670;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_a8;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79ae6,
             (size_t)&local_70,0x4f8,&local_a0,"\'\\xff\'",local_d0 + 8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4fa;
  file_05.m_begin = (iterator)&local_1c8;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1d8,
             msg_05);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  ToLower_abi_cxx11_(&local_58,(string_view)(ZEXT816(0xf73bdc) << 0x40));
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = (char **)0xf73098;
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0._0_8_ = "";
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013ae6d8;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = (string **)local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79afd,(size_t)&local_80,0x4fa,
             &local_a0,"\"\"",local_d0 + 8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
      &local_58.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4fb;
  file_06.m_begin = (iterator)&local_1e8;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f8,
             msg_06);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  str._M_str = "#HODL";
  str._M_len = 5;
  ToLower_abi_cxx11_(&local_58,str);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"#hodl");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = (char **)0xf73098;
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0._0_8_ = "#hodl";
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013ae618;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = (string **)local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79b0f,(size_t)&local_80,0x4fb,
             &local_a0,"\"#hodl\"",local_d0 + 8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
      &local_58.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4fc;
  file_07.m_begin = (iterator)&local_208;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_218,
             msg_07);
  local_108 = 0;
  local_111._1_8_ = &PTR__lazy_ostream_013ae088;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  ToLower_abi_cxx11_(&local_58,(string_view)(ZEXT816(0xf73090) << 0x40));
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = (char **)0xf73098;
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0._0_8_ = "";
  local_d0[0x10] = '\0';
  local_d0._8_8_ = &PTR__lazy_ostream_013ae898;
  local_d0._24_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = (string **)local_d0;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,(lazy_ostream *)(local_111 + 1),1,2,REQUIRE,0xf79b2e,(size_t)&local_80,0x4fc,
             &local_a0,"\"\\x00\\xfe\\xff\"",local_d0 + 8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
      &local_58.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ToLower)
{
    BOOST_CHECK_EQUAL(ToLower('@'), '@');
    BOOST_CHECK_EQUAL(ToLower('A'), 'a');
    BOOST_CHECK_EQUAL(ToLower('Z'), 'z');
    BOOST_CHECK_EQUAL(ToLower('['), '[');
    BOOST_CHECK_EQUAL(ToLower(0), 0);
    BOOST_CHECK_EQUAL(ToLower('\xff'), '\xff');

    BOOST_CHECK_EQUAL(ToLower(""), "");
    BOOST_CHECK_EQUAL(ToLower("#HODL"), "#hodl");
    BOOST_CHECK_EQUAL(ToLower("\x00\xfe\xff"), "\x00\xfe\xff");
}